

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O0

void __thiscall
Disa::Vector_Dense<double,_3UL>::Vector_Dense
          (Vector_Dense<double,_3UL> *this,initializer_list<double> *list)

{
  initializer_list<double> *this_00;
  size_type sVar1;
  ostream *poVar2;
  const_iterator pdVar3;
  source_location *in_RCX;
  double *item;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<double> *__range2;
  iterator iter;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  initializer_list<double> *local_18;
  initializer_list<double> *list_local;
  Vector_Dense<double,_3UL> *this_local;
  
  local_18 = list;
  list_local = (initializer_list<double> *)this;
  sVar1 = std::initializer_list<double>::size(list);
  if (sVar1 != 3) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    local_40 = &PTR_s__workspace_llm4binary_github_lic_001b64c8;
    console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,in_RCX);
    poVar2 = std::operator<<(poVar2,(string *)&local_38);
    sVar1 = std::initializer_list<double>::size(local_18);
    std::__cxx11::to_string(&local_f0,sVar1);
    std::operator+(&local_d0,"Initializer list of incorrect size, ",&local_f0);
    std::operator+(&local_b0,&local_d0," vs. ");
    std::__cxx11::to_string((string *)&iter,3);
    std::operator+(&local_90,&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iter);
    std::operator+(&local_70,&local_90,".");
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&iter);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_38);
    exit(1);
  }
  __range2 = (initializer_list<double> *)
             std::array<double,_3UL>::begin(&this->super_array<double,_3UL>);
  this_00 = local_18;
  __end0 = std::initializer_list<double>::begin(local_18);
  pdVar3 = std::initializer_list<double>::end(this_00);
  for (; __end0 != pdVar3; __end0 = __end0 + 1) {
    __range2->_M_array = (iterator)*__end0;
    __range2 = (initializer_list<double> *)&__range2->_M_len;
  }
  return;
}

Assistant:

Vector_Dense(const std::initializer_list<_type>& list) {
    ASSERT_DEBUG(list.size() == _size, "Initializer list of incorrect size, " + std::to_string(list.size()) + " vs. " +
                                       std::to_string(_size) + ".");
    auto iter = this->begin();
    FOR_EACH(item, list)* iter++ = item;
  }